

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_WriteString(BCWriterState *s,JSString *p)

{
  DynBuf *s_00;
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ushort local_2a;
  
  s_00 = &s->dbuf;
  dbuf_put_leb128(s_00,*(int *)&p->field_0x4 << 1 | (uint)(*(int *)&p->field_0x4 < 0));
  uVar2 = (uint)*(ulong *)&p->field_0x4;
  if (-1 < (int)uVar2) {
    dbuf_put(s_00,(uint8_t *)(p + 1),(ulong)(uVar2 & 0x7fffffff));
    return;
  }
  if ((*(ulong *)&p->field_0x4 & 0x7fffffff) != 0) {
    uVar3 = 0;
    do {
      uVar1 = *(ushort *)((long)&p[1].header.ref_count + uVar3 * 2);
      local_2a = uVar1 << 8 | uVar1 >> 8;
      if (s->field_0x38 == '\0') {
        local_2a = uVar1;
      }
      dbuf_put(s_00,(uint8_t *)&local_2a,2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < ((uint)*(undefined8 *)&p->field_0x4 & 0x7fffffff));
  }
  return;
}

Assistant:

static void JS_WriteString(BCWriterState *s, JSString *p)
{
    int i;
    bc_put_leb128(s, ((uint32_t)p->len << 1) | p->is_wide_char);
    if (p->is_wide_char) {
        for(i = 0; i < p->len; i++)
            bc_put_u16(s, p->u.str16[i]);
    } else {
        dbuf_put(&s->dbuf, p->u.str8, p->len);
    }
}